

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sexp.c
# Opt level: O3

int sexp_buffered_write_string_n(sexp ctx,char *str,sexp_uint_t len,sexp p)

{
  sexp *ppsVar1;
  int iVar2;
  size_t __n;
  sexp_uint_t sVar3;
  int iVar4;
  int iVar6;
  ulong uVar5;
  
  sVar3 = (p->value).port.offset;
  uVar5 = (p->value).port.size;
  iVar6 = 0;
  if (uVar5 <= sVar3 + len) {
    iVar6 = 0;
    do {
      iVar4 = (int)uVar5 - (int)sVar3;
      __n = (size_t)iVar4;
      memcpy((void *)((long)&((p->value).type.setters)->tag + sVar3),str,__n);
      (p->value).type.print = (sexp)(p->value).port.size;
      iVar2 = sexp_buffered_flush(ctx,p,0);
      if (iVar2 != 0) goto LAB_001112c8;
      sVar3 = (p->value).port.offset;
      uVar5 = (p->value).port.size;
      iVar6 = iVar6 + (int)uVar5;
      str = str + __n;
      len = len - __n;
    } while (uVar5 <= sVar3 + len);
  }
  memcpy((void *)((long)&((p->value).type.setters)->tag + sVar3),str,len);
  ppsVar1 = &(p->value).type.print;
  *ppsVar1 = (sexp)((long)&(*ppsVar1)->tag + len);
  iVar4 = (int)len;
LAB_001112c8:
  return iVar4 + iVar6;
}

Assistant:

int sexp_buffered_write_string_n (sexp ctx, const char *str,
                                  sexp_uint_t len, sexp p) {
  int diff, res, written=0;
  while (sexp_port_offset(p)+len >= sexp_port_size(p)) {
    diff = sexp_port_size(p) - sexp_port_offset(p);
    memcpy(sexp_port_buf(p)+sexp_port_offset(p), str, diff);
    sexp_port_offset(p) = sexp_port_size(p);
    if ((res = sexp_buffered_flush(ctx, p, 0)))
      return written + diff;
    written += sexp_port_size(p);
    str += diff;
    len -= diff;
  }
  memcpy(sexp_port_buf(p)+sexp_port_offset(p), str, len);
  sexp_port_offset(p) += len;
  return written + len;
}